

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::createYieldNode(Parser *this,Token *t,Node *optional_result)

{
  CompilationContext *ctx_;
  long in_RDX;
  Token *in_RDI;
  Node *n;
  Node *in_stack_ffffffffffffffd0;
  
  ctx_ = (CompilationContext *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffd0,ctx_,in_RDI);
  *(undefined4 *)
   &(ctx_->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0x2d;
  if (in_RDX != 0) {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffd0,
               (value_type *)ctx_);
  }
  return (Node *)ctx_;
}

Assistant:

Node * createYieldNode(Token & t, Node * optional_result)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_YIELD;
    if (optional_result)
      n->children.push_back(optional_result);
    return n;
  }